

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O1

Status __thiscall
leveldb::TableCache::Get
          (TableCache *this,ReadOptions *options,uint64_t file_number,uint64_t file_size,Slice *k,
          void *arg,_func_void_void_ptr_Slice_ptr_Slice_ptr *handle_result)

{
  undefined8 uVar1;
  long lVar2;
  long in_FS_OFFSET;
  Handle *handle;
  Table local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  FindTable(this,(uint64_t)options,file_size,(Handle **)k);
  uVar1 = local_38;
  if (this->env_ == (Env *)0x0) {
    lVar2 = (**(code **)(**(long **)(options + 3) + 0x28))(*(long **)(options + 3),local_38);
    Table::InternalGet(&local_40,*(ReadOptions **)(lVar2 + 8),(Slice *)file_number,arg,handle_result
                      );
    this->env_ = (Env *)local_40.rep_;
    (**(code **)(**(long **)(options + 3) + 0x20))(*(long **)(options + 3),uVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status TableCache::Get(const ReadOptions& options, uint64_t file_number,
                       uint64_t file_size, const Slice& k, void* arg,
                       void (*handle_result)(void*, const Slice&,
                                             const Slice&)) {
  Cache::Handle* handle = nullptr;
  Status s = FindTable(file_number, file_size, &handle);
  if (s.ok()) {
    Table* t = reinterpret_cast<TableAndFile*>(cache_->Value(handle))->table;
    s = t->InternalGet(options, k, arg, handle_result);
    cache_->Release(handle);
  }
  return s;
}